

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O2

bench_t now(void)

{
  ulong uVar1;
  double dVar2;
  timespec ts;
  
  timespec_get(&ts,1);
  dVar2 = (double)ts.tv_sec * 1000000000.0 + (double)ts.tv_nsec;
  uVar1 = (ulong)dVar2;
  return (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
}

Assistant:

bench_t now() {
#ifdef __MACH__
	return ((double)clock()) / CLOCKS_PER_SEC * 1e9;
#else
	struct timespec ts;
	timespec_get(&ts, TIME_UTC);

	return ts.tv_sec * 1e9 + ts.tv_nsec;

#endif
}